

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpcpp.hpp
# Opt level: O3

Json __thiscall jsonrpcpp::Id::to_json_abi_cxx11_(Id *this)

{
  int iVar1;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value jVar2;
  long in_RSI;
  Json JVar3;
  
  if (*(char *)(in_RSI + 9) == '\x02') {
    iVar1 = *(int *)(in_RSI + 0xc);
    *(undefined1 *)&(this->super_Entity)._vptr_Entity = 5;
    *(long *)&(this->super_Entity).entity = (long)iVar1;
  }
  else {
    if (*(char *)(in_RSI + 9) == '\x01') {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (in_RSI + 0x10));
      jVar2 = extraout_RDX;
      goto LAB_0012317e;
    }
    *(undefined1 *)&(this->super_Entity)._vptr_Entity = 0;
    *(undefined8 *)&(this->super_Entity).entity = 0;
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)this);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)this);
  jVar2 = extraout_RDX_00;
LAB_0012317e:
  JVar3.m_value.object = jVar2.object;
  JVar3._0_8_ = this;
  return JVar3;
}

Assistant:

inline Json Id::to_json() const
{
    if (type_ == value_t::null)
        return nullptr;
    if (type_ == value_t::string)
        return string_id_;
    if (type_ == value_t::integer)
        return int_id_;

    return nullptr;
}